

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCodeMetadataExpr
          (ExprVisitorDelegate *this,CodeMetadataExpr *expr)

{
  WatWriter *pWVar1;
  size_t size;
  char *src;
  pointer data;
  undefined1 local_29;
  
  pWVar1 = this->writer_;
  WritePuts(pWVar1,"(",None);
  WritePuts(pWVar1,"@metadata.code.",None);
  pWVar1->indent_ = pWVar1->indent_ + 2;
  pWVar1 = this->writer_;
  size = (expr->name)._M_len;
  src = (expr->name)._M_str;
  WriteNextChar(pWVar1);
  Stream::WriteData(pWVar1->stream_,src,size,(char *)0x0,No);
  local_29 = 0x20;
  Stream::WriteData(this->writer_->stream_,&local_29,1,(char *)0x0,No);
  data = (expr->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  WriteQuotedData(this->writer_,data,
                  (long)(expr->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)data);
  WriteClose(this->writer_,Space);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCodeMetadataExpr(
    CodeMetadataExpr* expr) {
  writer_->WriteOpen("@metadata.code.", NextChar::None);
  writer_->WriteDataWithNextChar(expr->name.data(), expr->name.size());
  writer_->WritePutc(' ');
  writer_->WriteQuotedData(expr->data.data(), expr->data.size());
  writer_->WriteCloseSpace();
  return Result::Ok;
}